

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O2

void array_suite::test_integer_nested_many_siblings(void)

{
  bool bVar1;
  int iVar2;
  reader reader;
  char input [10];
  uint local_18c;
  view_type local_188;
  basic_reader<char> local_178;
  char local_30 [16];
  
  builtin_strncpy(local_30,"[[1],[2]]",10);
  local_188._M_len = strlen(local_30);
  local_188._M_str = local_30;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_178,&local_188);
  local_188._M_len = CONCAT44(local_188._M_len._4_4_,local_178.decoder.current.code);
  local_18c = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,399,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len = trial::protocol::json::basic_reader<char>::level(&local_178);
  local_18c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,400,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len =
       (long)local_178.decoder.current.view.tail - (long)local_178.decoder.current.view.head;
  local_188._M_str = local_178.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"[\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x191,"void array_suite::test_integer_nested_many_siblings()",&local_188,"[");
  local_188._M_len = (long)local_178.decoder.input.tail - (long)local_178.decoder.input.head;
  local_188._M_str = local_178.decoder.input.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[9]>
            ("reader.tail()","\"[1],[2]]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x192,"void array_suite::test_integer_nested_many_siblings()",&local_188,"[1],[2]]");
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_178);
  local_188._M_len = CONCAT71(local_188._M_len._1_7_,bVar1);
  local_18c = CONCAT31(local_18c._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x194,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len = CONCAT44(local_188._M_len._4_4_,local_178.decoder.current.code);
  local_18c = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x195,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len = trial::protocol::json::basic_reader<char>::level(&local_178);
  local_18c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x196,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len =
       (long)local_178.decoder.current.view.tail - (long)local_178.decoder.current.view.head;
  local_188._M_str = local_178.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"[\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x197,"void array_suite::test_integer_nested_many_siblings()",&local_188,"[");
  local_188._M_len = (long)local_178.decoder.input.tail - (long)local_178.decoder.input.head;
  local_188._M_str = local_178.decoder.input.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[8]>
            ("reader.tail()","\"1],[2]]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x198,"void array_suite::test_integer_nested_many_siblings()",&local_188,"1],[2]]");
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_178);
  local_188._M_len = CONCAT71(local_188._M_len._1_7_,bVar1);
  local_18c = CONCAT31(local_18c._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x19a,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_18c = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x19b,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  iVar2 = trial::protocol::json::basic_reader<char>::overloader<int,_void>::value(&local_178);
  local_188._M_len = CONCAT44(local_188._M_len._4_4_,iVar2);
  local_18c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<int>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x19c,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len = trial::protocol::json::basic_reader<char>::level(&local_178);
  local_18c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x19d,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len =
       (long)local_178.decoder.current.view.tail - (long)local_178.decoder.current.view.head;
  local_188._M_str = local_178.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"1\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x19e,"void array_suite::test_integer_nested_many_siblings()",&local_188,"1");
  local_188._M_len = (long)local_178.decoder.input.tail - (long)local_178.decoder.input.head;
  local_188._M_str = local_178.decoder.input.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[7]>
            ("reader.tail()","\"],[2]]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x19f,"void array_suite::test_integer_nested_many_siblings()",&local_188,"],[2]]");
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_178);
  local_188._M_len = CONCAT71(local_188._M_len._1_7_,bVar1);
  local_18c = CONCAT31(local_18c._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1a1,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len = CONCAT44(local_188._M_len._4_4_,local_178.decoder.current.code);
  local_18c = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1a2,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len = trial::protocol::json::basic_reader<char>::level(&local_178);
  local_18c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1a3,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len =
       (long)local_178.decoder.current.view.tail - (long)local_178.decoder.current.view.head;
  local_188._M_str = local_178.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1a4,"void array_suite::test_integer_nested_many_siblings()",&local_188,"]");
  local_188._M_len = (long)local_178.decoder.input.tail - (long)local_178.decoder.input.head;
  local_188._M_str = local_178.decoder.input.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[6]>
            ("reader.tail()","\",[2]]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1a5,"void array_suite::test_integer_nested_many_siblings()",&local_188,",[2]]");
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_178);
  local_188._M_len = CONCAT71(local_188._M_len._1_7_,bVar1);
  local_18c = CONCAT31(local_18c._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1a7,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len = CONCAT44(local_188._M_len._4_4_,local_178.decoder.current.code);
  local_18c = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1a8,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len = trial::protocol::json::basic_reader<char>::level(&local_178);
  local_18c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1a9,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len =
       (long)local_178.decoder.current.view.tail - (long)local_178.decoder.current.view.head;
  local_188._M_str = local_178.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"[\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1aa,"void array_suite::test_integer_nested_many_siblings()",&local_188,"[");
  local_188._M_len = (long)local_178.decoder.input.tail - (long)local_178.decoder.input.head;
  local_188._M_str = local_178.decoder.input.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[4]>
            ("reader.tail()","\"2]]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1ab,"void array_suite::test_integer_nested_many_siblings()",&local_188,"2]]");
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_178);
  local_188._M_len = CONCAT71(local_188._M_len._1_7_,bVar1);
  local_18c = CONCAT31(local_18c._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1ad,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_18c = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1ae,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  iVar2 = trial::protocol::json::basic_reader<char>::overloader<int,_void>::value(&local_178);
  local_188._M_len = CONCAT44(local_188._M_len._4_4_,iVar2);
  local_18c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<int>()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1af,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len = trial::protocol::json::basic_reader<char>::level(&local_178);
  local_18c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1b0,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len =
       (long)local_178.decoder.current.view.tail - (long)local_178.decoder.current.view.head;
  local_188._M_str = local_178.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"2\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1b1,"void array_suite::test_integer_nested_many_siblings()",&local_188,"2");
  local_188._M_len = (long)local_178.decoder.input.tail - (long)local_178.decoder.input.head;
  local_188._M_str = local_178.decoder.input.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[3]>
            ("reader.tail()","\"]]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1b2,"void array_suite::test_integer_nested_many_siblings()",&local_188,"]]");
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_178);
  local_188._M_len = CONCAT71(local_188._M_len._1_7_,bVar1);
  local_18c = CONCAT31(local_18c._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1b4,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len = CONCAT44(local_188._M_len._4_4_,local_178.decoder.current.code);
  local_18c = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1b5,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len = trial::protocol::json::basic_reader<char>::level(&local_178);
  local_18c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1b6,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len =
       (long)local_178.decoder.current.view.tail - (long)local_178.decoder.current.view.head;
  local_188._M_str = local_178.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1b7,"void array_suite::test_integer_nested_many_siblings()",&local_188,"]");
  local_188._M_len = (long)local_178.decoder.input.tail - (long)local_178.decoder.input.head;
  local_188._M_str = local_178.decoder.input.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.tail()","\"]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1b8,"void array_suite::test_integer_nested_many_siblings()",&local_188,"]");
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_178);
  local_188._M_len = CONCAT71(local_188._M_len._1_7_,bVar1);
  local_18c = CONCAT31(local_18c._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1ba,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len = CONCAT44(local_188._M_len._4_4_,local_178.decoder.current.code);
  local_18c = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1bb,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len = trial::protocol::json::basic_reader<char>::level(&local_178);
  local_18c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1bc,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len =
       (long)local_178.decoder.current.view.tail - (long)local_178.decoder.current.view.head;
  local_188._M_str = local_178.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1bd,"void array_suite::test_integer_nested_many_siblings()",&local_188,"]");
  local_188._M_len = (long)local_178.decoder.input.tail - (long)local_178.decoder.input.head;
  local_188._M_str = local_178.decoder.input.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[1]>
            ("reader.tail()","\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1be,"void array_suite::test_integer_nested_many_siblings()",&local_188,"");
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_178);
  local_188._M_len = CONCAT71(local_188._M_len._1_7_,bVar1);
  local_18c = local_18c & 0xffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1c0,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len = CONCAT44(local_188._M_len._4_4_,local_178.decoder.current.code);
  local_18c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1c1,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  local_188._M_len = trial::protocol::json::basic_reader<char>::level(&local_178);
  local_18c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1c2,"void array_suite::test_integer_nested_many_siblings()",&local_188,&local_18c);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&local_178.stack);
  return;
}

Assistant:

void test_integer_nested_many_siblings()
{
    const char input[] = "[[1],[2]]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "[");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "[1],[2]]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "[");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "1],[2]]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "1");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "],[2]]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "]");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), ",[2]]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "[");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "2]]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "2");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "]]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "]");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "]");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 0);
}